

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_wString __thiscall
ON_SubDVertex::ToString(ON_SubDVertex *this,bool bIncludeControlNetPoint,bool bIncludeTopology)

{
  ulong uVar1;
  uint uVar2;
  wchar_t *pwVar3;
  ulong uVar4;
  byte in_CL;
  undefined7 in_register_00000031;
  ON_SubDVertex *this_00;
  ON_wString local_88;
  ON_SubDFace *local_80;
  ON_SubDFace *f;
  unsigned_short vfi;
  ON_wString flist;
  ON_SubDEdge *e;
  ON_SubDEdgePtr eptr;
  unsigned_short vei;
  ON_wString elist;
  undefined1 local_28 [8];
  ON_wString vtag;
  bool bIncludeTopology_local;
  bool bIncludeControlNetPoint_local;
  ON_SubDVertex *this_local;
  ON_wString *v;
  
  this_00 = (ON_SubDVertex *)CONCAT71(in_register_00000031,bIncludeControlNetPoint);
  vtag.m_s._6_1_ = in_CL & 1;
  vtag.m_s._7_1_ = bIncludeTopology;
  ON_SubD::VertexTagToString((ON_SubD *)local_28,this_00->m_vertex_tag,false);
  if ((vtag.m_s._7_1_ & 1) == 0) {
    uVar2 = (this_00->super_ON_SubDComponentBase).m_id;
    pwVar3 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_28);
    ON_wString::FormatToString((wchar_t *)this,L"v%u %ls",(ulong)uVar2,pwVar3);
  }
  else {
    uVar2 = (this_00->super_ON_SubDComponentBase).m_id;
    pwVar3 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_28);
    ON_wString::FormatToString
              ((wchar_t *)this,this_00->m_P[0],this_00->m_P[1],this_00->m_P[2],L"v%u %ls (%g,%g,%g)"
               ,(ulong)uVar2,pwVar3);
  }
  if ((vtag.m_s._6_1_ & 1) != 0) {
    uVar2 = EdgeCount(this_00);
    ON_wString::FormatToString((wchar_t *)&stack0xffffffffffffffb8,L" Edges[%u]",(ulong)uVar2);
    if ((this_00->m_edges != (ON_SubDEdgePtr *)0x0) && (this_00->m_edge_count != 0)) {
      ON_wString::operator+=((ON_wString *)&stack0xffffffffffffffb8,L"={");
      for (eptr.m_ptr._6_2_ = 0; eptr.m_ptr._6_2_ < this_00->m_edge_count;
          eptr.m_ptr._6_2_ = eptr.m_ptr._6_2_ + 1) {
        uVar1 = this_00->m_edges[eptr.m_ptr._6_2_].m_ptr;
        uVar4 = uVar1 & 0xfffffffffffffff8;
        if (eptr.m_ptr._6_2_ != 0) {
          ON_wString::operator+=((ON_wString *)&stack0xffffffffffffffb8,L", ");
        }
        if (uVar4 == 0) {
          ON_wString::operator+=((ON_wString *)&stack0xffffffffffffffb8,L"Null");
        }
        else {
          if ((uVar1 & 1) == 0) {
            ON_wString::FormatToString((wchar_t *)&flist,L"+e%u",(ulong)*(uint *)(uVar4 + 8));
          }
          else {
            ON_wString::FormatToString((wchar_t *)&flist,L"-e%u",(ulong)*(uint *)(uVar4 + 8));
          }
          ON_wString::operator+=((ON_wString *)&stack0xffffffffffffffb8,&flist);
          ON_wString::~ON_wString(&flist);
        }
      }
      ON_wString::operator+=((ON_wString *)&stack0xffffffffffffffb8,L"}");
    }
    ON_wString::operator+=((ON_wString *)this,(ON_wString *)&stack0xffffffffffffffb8);
    uVar2 = FaceCount(this_00);
    ON_wString::FormatToString((wchar_t *)&stack0xffffffffffffff90,L" Faces[%u]",(ulong)uVar2);
    if ((this_00->m_faces != (ON_SubDFace **)0x0) && (this_00->m_face_count != 0)) {
      ON_wString::operator+=((ON_wString *)&stack0xffffffffffffff90,L"={");
      for (f._6_2_ = 0; f._6_2_ < this_00->m_face_count; f._6_2_ = f._6_2_ + 1) {
        local_80 = this_00->m_faces[f._6_2_];
        if (f._6_2_ != 0) {
          ON_wString::operator+=((ON_wString *)&stack0xffffffffffffff90,L", ");
        }
        if (local_80 == (ON_SubDFace *)0x0) {
          ON_wString::operator+=((ON_wString *)&stack0xffffffffffffff90,L"Null");
        }
        else {
          ON_wString::FormatToString
                    ((wchar_t *)&local_88,L"f%u",(ulong)(local_80->super_ON_SubDComponentBase).m_id)
          ;
          ON_wString::operator+=((ON_wString *)&stack0xffffffffffffff90,&local_88);
          ON_wString::~ON_wString(&local_88);
        }
      }
      ON_wString::operator+=((ON_wString *)&stack0xffffffffffffff90,L"}");
    }
    ON_wString::operator+=((ON_wString *)this,(ON_wString *)&stack0xffffffffffffff90);
    ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffff90);
    ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffffb8);
  }
  ON_wString::~ON_wString((ON_wString *)local_28);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_SubDVertex::ToString(
  bool bIncludeControlNetPoint,
  bool bIncludeTopology
) const
{
  const ON_wString vtag = ON_SubD::VertexTagToString(m_vertex_tag,false);
  ON_wString v
    = bIncludeControlNetPoint
    ? ON_wString::FormatToString(L"v%u %ls (%g,%g,%g)", m_id, static_cast<const wchar_t*>(vtag), m_P[0], m_P[1], m_P[2])
    : ON_wString::FormatToString(L"v%u %ls", m_id, static_cast<const wchar_t*>(vtag))
    ;
  if (bIncludeTopology)
  {
    ON_wString elist = ON_wString::FormatToString(L" Edges[%u]", EdgeCount());
    if (nullptr != m_edges && m_edge_count > 0)
    {
      elist += L"={";
      for (unsigned short vei = 0; vei < m_edge_count; ++vei)
      {
        const ON_SubDEdgePtr eptr = m_edges[vei];
        const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(eptr.m_ptr);
        if (vei > 0)
          elist += L", ";
        if (nullptr == e)
          elist += L"Null";
        else
        {
          elist += (0 == ON_SUBD_EDGE_DIRECTION(eptr.m_ptr)) ? ON_wString::FormatToString(L"+e%u", e->m_id) : ON_wString::FormatToString(L"-e%u", e->m_id);
        }
      }
      elist += L"}";
    }
    v += elist;

    ON_wString flist = ON_wString::FormatToString(L" Faces[%u]", FaceCount());
    if (nullptr != m_faces && m_face_count > 0)
    {
      flist += L"={";
      for (unsigned short vfi = 0; vfi < m_face_count; ++vfi)
      {
        const ON_SubDFace* f = m_faces[vfi];
        if (vfi > 0)
          flist += L", ";
        if (nullptr == f)
          flist += L"Null";
        else
        {
          flist += ON_wString::FormatToString(L"f%u", f->m_id);
        }
      }
      flist += L"}";
    }
    v += flist;
  }
  return v;
}